

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_file_reader.cpp
# Opt level: O3

void __thiscall
duckdb::BufferedFileReader::ReadData
          (BufferedFileReader *this,data_ptr_t target_buffer,uint64_t read_size)

{
  FileSystem *pFVar1;
  int iVar2;
  ulong uVar3;
  type pFVar4;
  undefined4 extraout_var;
  SerializationException *this_00;
  data_ptr_t pdVar6;
  ulong __n;
  string local_50;
  idx_t iVar5;
  
  pdVar6 = target_buffer + read_size;
  iVar5 = this->read_data;
  while( true ) {
    uVar3 = (long)pdVar6 - (long)target_buffer;
    __n = iVar5 - this->offset;
    if (uVar3 < __n) {
      __n = uVar3;
    }
    if (__n != 0) {
      switchD_00b041bd::default
                (target_buffer,
                 (this->data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + this->offset,__n);
      this->offset = this->offset + __n;
      target_buffer = target_buffer + __n;
    }
    if (pdVar6 <= target_buffer) break;
    pFVar1 = this->fs;
    this->total_read = this->total_read + this->read_data;
    this->offset = 0;
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    iVar2 = (*pFVar1->_vptr_FileSystem[5])
                      (pFVar1,pFVar4,
                       (this->data).
                       super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x1000);
    iVar5 = CONCAT44(extraout_var,iVar2);
    this->read_data = iVar5;
    if (iVar5 == 0) {
      this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"not enough data in file to deserialize result","");
      SerializationException::SerializationException(this_00,&local_50);
      __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void BufferedFileReader::ReadData(data_ptr_t target_buffer, uint64_t read_size) {
	// first copy anything we can from the buffer
	data_ptr_t end_ptr = target_buffer + read_size;
	while (true) {
		idx_t to_read = MinValue<idx_t>(UnsafeNumericCast<idx_t>(end_ptr - target_buffer), read_data - offset);
		if (to_read > 0) {
			memcpy(target_buffer, data.get() + offset, to_read);
			offset += to_read;
			target_buffer += to_read;
		}
		if (target_buffer < end_ptr) {
			D_ASSERT(offset == read_data);
			total_read += read_data;
			// did not finish reading yet but exhausted buffer
			// read data into buffer
			offset = 0;
			read_data = UnsafeNumericCast<idx_t>(fs.Read(*handle, data.get(), FILE_BUFFER_SIZE));
			if (read_data == 0) {
				throw SerializationException("not enough data in file to deserialize result");
			}
		} else {
			return;
		}
	}
}